

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfbbackingstore.cpp
# Opt level: O2

void __thiscall QFbBackingStore::resize(QFbBackingStore *this,QSize *size,QRegion *staticContents)

{
  Format FVar1;
  undefined8 uVar2;
  long *plVar3;
  long in_FS_OFFSET;
  QImage aQStack_38 [24];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = QImage::size();
  if (((size->wd).m_i != (int)uVar2) || ((size->ht).m_i != (int)((ulong)uVar2 >> 0x20))) {
    QPlatformBackingStore::window();
    QWindow::screen();
    plVar3 = (long *)QScreen::handle();
    FVar1 = (**(code **)(*plVar3 + 0x38))(plVar3);
    QImage::QImage(aQStack_38,size,FVar1);
    QImage::operator=(&this->mImage,aQStack_38);
    QImage::~QImage(aQStack_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFbBackingStore::resize(const QSize &size, const QRegion &staticContents)
{
    Q_UNUSED(staticContents);

    if (mImage.size() != size)
        mImage = QImage(size, window()->screen()->handle()->format());
}